

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  element_type *peVar1;
  __int_type_conflict _Var2;
  ostream *poVar3;
  ostream *poVar4;
  ostream *in_RSI;
  float in_XMM0_Da;
  double dVar5;
  float in_XMM1_Da;
  int64_t eta;
  double wst;
  double lr;
  double t;
  __atomic_base<long> *in_stack_ffffffffffffff58;
  time_point *in_stack_ffffffffffffff60;
  ClockPrint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  double local_38;
  double local_30;
  undefined8 local_28;
  double local_20;
  ostream *local_18;
  float local_10;
  float local_c;
  
  local_18 = in_RSI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  local_28 = std::chrono::_V2::steady_clock::now();
  local_20 = utils::getDuration(in_stack_ffffffffffffff60,(time_point *)in_stack_ffffffffffffff58);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x190ff1);
  local_30 = peVar1->lr * (1.0 - (double)local_c);
  local_38 = 0.0;
  local_40 = 0x278d00;
  if ((0.0 < local_c) && (0.0 <= local_20)) {
    local_c = local_c * 100.0;
    local_40 = (long)((local_20 * (double)(100.0 - local_c)) / (double)local_c);
    _Var2 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff58);
    dVar5 = (double)_Var2 / local_20;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1910e3);
    local_38 = dVar5 / (double)peVar1->thread;
  }
  std::ostream::operator<<(local_18,std::fixed);
  std::operator<<(local_18,"Progress: ");
  poVar3 = local_18;
  local_44 = (int)std::setprecision(1);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_44);
  local_48 = (int)std::setw(5);
  poVar3 = std::operator<<(poVar3,(_Setw)local_48);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  std::operator<<(poVar3,"%");
  poVar3 = std::operator<<(local_18," words/sec/thread: ");
  local_4c = (int)std::setw(7);
  poVar3 = std::operator<<(poVar3,(_Setw)local_4c);
  std::ostream::operator<<(poVar3,(long)local_38);
  poVar3 = std::operator<<(local_18," lr: ");
  local_50 = (int)std::setw(9);
  poVar3 = std::operator<<(poVar3,(_Setw)local_50);
  local_54 = (int)std::setprecision(6);
  poVar3 = std::operator<<(poVar3,(_Setprecision)local_54);
  std::ostream::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(local_18," avg.loss: ");
  local_58 = (int)std::setw(9);
  poVar3 = std::operator<<(poVar3,(_Setw)local_58);
  local_5c = (int)std::setprecision(6);
  poVar4 = std::operator<<(poVar3,(_Setprecision)local_5c);
  std::ostream::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(local_18," ETA: ");
  utils::ClockPrint::ClockPrint(&local_60,(int32_t)local_40);
  utils::operator<<(poVar4,(ClockPrint *)poVar3);
  std::ostream::operator<<(local_18,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  double t = utils::getDuration(start_, std::chrono::steady_clock::now());
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    progress = progress * 100;
    eta = t * (100 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << progress << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " avg.loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << utils::ClockPrint(eta);
  log_stream << std::flush;
}